

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O0

int x86LEA(uchar *stream,x86Reg dst,uint labelID,int shift)

{
  uint uVar1;
  UnsatisfiedJump local_38;
  uchar *local_28;
  uchar *start;
  uint local_18;
  int shift_local;
  uint labelID_local;
  x86Reg dst_local;
  uchar *stream_local;
  
  local_18 = labelID & 0x7fffffff;
  _labelID_local = stream + 1;
  *stream = 0x8d;
  local_28 = stream;
  start._4_4_ = shift;
  shift_local = dst;
  UnsatisfiedJump::UnsatisfiedJump(&local_38,local_18,true,_labelID_local);
  FastVector<UnsatisfiedJump,_false,_false>::push_back(&pendingJumps,&local_38);
  uVar1 = encodeAddress(_labelID_local,rNONE,1,rNONE,-0x32323233,(int)regCode[(uint)shift_local]);
  return ((int)_labelID_local + uVar1) - (int)local_28;
}

Assistant:

int x86LEA(unsigned char *stream, x86Reg dst, unsigned int labelID, int shift)
{
	unsigned char *start = stream;

	labelID &= 0x7FFFFFFF;
	(void)shift;

	*stream++ = 0x8d;
	
	pendingJumps.push_back(UnsatisfiedJump(labelID, true, stream));
	stream += encodeAddress(stream, rNONE, 1, rNONE, 0xcdcdcdcd, regCode[dst]);

	return int(stream - start);
}